

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpring2Constraint::calculateLinearInfo(btGeneric6DofSpring2Constraint *this)

{
  btScalar bVar1;
  btVector3 *pbVar2;
  btScalar *pbVar3;
  long in_RDI;
  btTranslationalLimitMotor2 *this_00;
  btVector3 bVar4;
  int i;
  btVector3 *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_5c;
  btMatrix3x3 *in_stack_ffffffffffffffd0;
  
  pbVar2 = btTransform::getOrigin((btTransform *)(in_RDI + 0x52c));
  this_00 = (btTranslationalLimitMotor2 *)(in_RDI + 0x4ec);
  btTransform::getOrigin((btTransform *)this_00);
  bVar4 = operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    in_stack_ffffffffffffff68);
  *(long *)(in_RDI + 0x5ac) = bVar4.m_floats._0_8_;
  *(long *)(in_RDI + 0x5b4) = bVar4.m_floats._8_8_;
  btTransform::getBasis((btTransform *)this_00);
  btMatrix3x3::inverse(in_stack_ffffffffffffffd0);
  bVar4 = ::operator*((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff68);
  *(long *)(in_RDI + 0x5ac) = bVar4.m_floats._0_8_;
  *(long *)(in_RDI + 0x5b4) = bVar4.m_floats._8_8_;
  for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
    pbVar3 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x5ac));
    bVar1 = pbVar3[local_5c];
    pbVar3 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x3c4));
    pbVar3[local_5c] = bVar1;
    btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x5ac));
    btTranslationalLimitMotor2::testLimitValue(this_00,(int)((ulong)pbVar2 >> 0x20),SUB84(pbVar2,0))
    ;
  }
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::calculateLinearInfo()
{
	m_calculatedLinearDiff = m_calculatedTransformB.getOrigin() - m_calculatedTransformA.getOrigin();
	m_calculatedLinearDiff = m_calculatedTransformA.getBasis().inverse() * m_calculatedLinearDiff;
	for(int i = 0; i < 3; i++)
	{
		m_linearLimits.m_currentLinearDiff[i] = m_calculatedLinearDiff[i];
		m_linearLimits.testLimitValue(i, m_calculatedLinearDiff[i]);
	}
}